

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileAPICodemodel.cxx
# Opt level: O0

Value * __thiscall
anon_unknown.dwarf_ab3c04::Target::DumpInstallDestinations
          (Value *__return_storage_ptr__,Target *this)

{
  bool bVar1;
  vector<cmInstallTargetGenerator_*,_std::allocator<cmInstallTargetGenerator_*>_> *__x;
  reference ppcVar2;
  Value local_90;
  cmInstallTargetGenerator *local_68;
  cmInstallTargetGenerator *itGen;
  iterator __end1;
  iterator __begin1;
  vector<cmInstallTargetGenerator_*,_std::allocator<cmInstallTargetGenerator_*>_> *__range1;
  undefined1 local_38 [8];
  vector<cmInstallTargetGenerator_*,_std::allocator<cmInstallTargetGenerator_*>_> installGens;
  Target *this_local;
  Value *destinations;
  
  installGens.
  super__Vector_base<cmInstallTargetGenerator_*,_std::allocator<cmInstallTargetGenerator_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ = 0;
  Json::Value::Value(__return_storage_ptr__,arrayValue);
  __x = cmTarget::GetInstallGenerators(this->GT->Target);
  std::vector<cmInstallTargetGenerator_*,_std::allocator<cmInstallTargetGenerator_*>_>::vector
            ((vector<cmInstallTargetGenerator_*,_std::allocator<cmInstallTargetGenerator_*>_> *)
             local_38,__x);
  __end1 = std::vector<cmInstallTargetGenerator_*,_std::allocator<cmInstallTargetGenerator_*>_>::
           begin((vector<cmInstallTargetGenerator_*,_std::allocator<cmInstallTargetGenerator_*>_> *)
                 local_38);
  itGen = (cmInstallTargetGenerator *)
          std::vector<cmInstallTargetGenerator_*,_std::allocator<cmInstallTargetGenerator_*>_>::end
                    ((vector<cmInstallTargetGenerator_*,_std::allocator<cmInstallTargetGenerator_*>_>
                      *)local_38);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<cmInstallTargetGenerator_**,_std::vector<cmInstallTargetGenerator_*,_std::allocator<cmInstallTargetGenerator_*>_>_>
                                *)&itGen);
    if (!bVar1) break;
    ppcVar2 = __gnu_cxx::
              __normal_iterator<cmInstallTargetGenerator_**,_std::vector<cmInstallTargetGenerator_*,_std::allocator<cmInstallTargetGenerator_*>_>_>
              ::operator*(&__end1);
    local_68 = *ppcVar2;
    DumpInstallDestination(&local_90,this,local_68);
    Json::Value::append(__return_storage_ptr__,&local_90);
    Json::Value::~Value(&local_90);
    __gnu_cxx::
    __normal_iterator<cmInstallTargetGenerator_**,_std::vector<cmInstallTargetGenerator_*,_std::allocator<cmInstallTargetGenerator_*>_>_>
    ::operator++(&__end1);
  }
  installGens.
  super__Vector_base<cmInstallTargetGenerator_*,_std::allocator<cmInstallTargetGenerator_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ = 1;
  std::vector<cmInstallTargetGenerator_*,_std::allocator<cmInstallTargetGenerator_*>_>::~vector
            ((vector<cmInstallTargetGenerator_*,_std::allocator<cmInstallTargetGenerator_*>_> *)
             local_38);
  if ((installGens.
       super__Vector_base<cmInstallTargetGenerator_*,_std::allocator<cmInstallTargetGenerator_*>_>.
       _M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ & 1) == 0) {
    Json::Value::~Value(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

Json::Value Target::DumpInstallDestinations()
{
  Json::Value destinations = Json::arrayValue;
  auto installGens = this->GT->Target->GetInstallGenerators();
  for (auto* itGen : installGens) {
    destinations.append(this->DumpInstallDestination(itGen));
  }
  return destinations;
}